

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this)

{
  Syntax SVar1;
  char *pcVar2;
  StrWriter *this_local;
  
  SVar1 = this->style->syntax;
  if (SVar1 == MOIRA_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '%';
LAB_0013739a:
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'P';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'C';
  }
  else {
    if (SVar1 != GNU) {
      if (SVar1 != GNU_MIT) goto LAB_0013739a;
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '%';
    }
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'p';
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = 'c';
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Pc _)
{
    switch (style.syntax) {

        case Syntax::GNU_MIT:      *ptr++ = '%'; [[fallthrough]];
       case Syntax::GNU:          *ptr++ = 'p'; *ptr++ = 'c'; break;
        case Syntax::MOIRA_MIT:    *ptr++ = '%'; [[fallthrough]];
        
        default:
            *ptr++ = 'P'; *ptr++ = 'C'; break;
    }

    return *this;
}